

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O3

bool __thiscall QShaderDescription::isValid(QShaderDescription *this)

{
  QShaderDescriptionPrivate *pQVar1;
  
  pQVar1 = this->d;
  if (((((((pQVar1->inVars).d.size == 0) && ((pQVar1->outVars).d.size == 0)) &&
        ((pQVar1->uniformBlocks).d.size == 0)) &&
       (((pQVar1->pushConstantBlocks).d.size == 0 && ((pQVar1->storageBlocks).d.size == 0)))) &&
      (((pQVar1->combinedImageSamplers).d.size == 0 &&
       (((pQVar1->storageImages).d.size == 0 && ((pQVar1->separateImages).d.size == 0)))))) &&
     (((pQVar1->separateSamplers).d.size == 0 && ((pQVar1->inBuiltins).d.size == 0)))) {
    return (pQVar1->outBuiltins).d.size != 0;
  }
  return true;
}

Assistant:

bool QShaderDescription::isValid() const
{
    return !d->inVars.isEmpty() || !d->outVars.isEmpty()
        || !d->uniformBlocks.isEmpty() || !d->pushConstantBlocks.isEmpty() || !d->storageBlocks.isEmpty()
        || !d->combinedImageSamplers.isEmpty() || !d->storageImages.isEmpty()
        || !d->separateImages.isEmpty() || !d->separateSamplers.isEmpty()
        || !d->inBuiltins.isEmpty() || !d->outBuiltins.isEmpty();
}